

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall Pool::~Pool(Pool *this)

{
  std::
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::
  ~_Rb_tree(&(this->delayed_)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Pool(const std::string& name, int depth)
    : name_(name), current_use_(0), depth_(depth), delayed_() {}